

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O2

void __thiscall pass_insert_clk_en_Test::TestBody(pass_insert_clk_en_Test *this)

{
  _Rb_tree_header *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 this_01;
  Generator *pGVar2;
  Port *pPVar3;
  Port *pPVar4;
  Port *pPVar5;
  Var *pVVar6;
  Port *pPVar7;
  Const *right;
  Generator *this_02;
  iterator iVar8;
  mapped_type *pmVar9;
  long lVar10;
  Generator *top;
  char *in_R9;
  undefined1 local_2c8 [8];
  Context c;
  shared_ptr<kratos::SequentialStmtBlock> child_seq3;
  undefined1 local_170 [8];
  shared_ptr<kratos::IfStmt> if_child2;
  shared_ptr<kratos::IfStmt> if_child3;
  shared_ptr<kratos::SequentialStmtBlock> seq;
  shared_ptr<kratos::IfStmt> if_;
  shared_ptr<kratos::SequentialStmtBlock> child_seq;
  shared_ptr<kratos::SequentialStmtBlock> child_seq2;
  allocator<char> local_108 [8];
  AssertionResult gtest_ar__4;
  mapped_type child_src;
  mapped_type child_src2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  undefined1 auStack_88 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  src;
  mapped_type parent_src;
  
  kratos::Context::Context((Context *)local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"parent",
             (allocator<char> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pGVar2 = kratos::Context::generator((Context *)local_2c8,(string *)auStack_88);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"clk",
             (allocator<char> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pPVar3 = kratos::Generator::port(pGVar2,In,(string *)auStack_88,1,Clock);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"rst",
             (allocator<char> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pPVar4 = kratos::Generator::port(pGVar2,In,(string *)auStack_88,1,AsyncReset);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"a",
             (allocator<char> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pPVar5 = kratos::Generator::port(pGVar2,Out,(string *)auStack_88,1);
  std::__cxx11::string::~string((string *)auStack_88);
  kratos::Generator::sequential
            ((Generator *)
             &if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  _Var1 = if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  child_seq3.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pGVar2;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar3->super_Var).super_enable_shared_from_this<kratos::Var>);
  this_00 = &src._M_t._M_impl.super__Rb_tree_header;
  auStack_88._0_4_ = Posedge;
  src._M_t._M_impl._0_8_ = src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = parent_src._M_dataplus._M_p;
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)_Var1._M_pi,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)auStack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  _Var1 = if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar4->super_Var).super_enable_shared_from_this<kratos::Var>);
  auStack_88 = (undefined1  [8])((ulong)(uint)auStack_88._4_4_ << 0x20);
  src._M_t._M_impl._0_8_ = src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = parent_src._M_dataplus._M_p;
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)_Var1._M_pi,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)auStack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  std::make_shared<kratos::IfStmt,kratos::Port&>
            ((Port *)&seq.
                      super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  _Var1 = seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      &pPVar5->super_Var);
  auStack_88 = (undefined1  [8])src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  src._M_t._M_impl._0_8_ = parent_src._M_dataplus._M_p;
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt((IfStmt *)_Var1._M_pi,(shared_ptr<kratos::Stmt> *)auStack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  kratos::Const::constant(0,1,false);
  kratos::Var::assign((Var *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      &pPVar5->super_Var);
  auStack_88 = (undefined1  [8])src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  src._M_t._M_impl._0_8_ = parent_src._M_dataplus._M_p;
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_else_stmt
            ((IfStmt *)
             seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,(shared_ptr<kratos::Stmt> *)auStack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_88,
             (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
             &seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)
             if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi,(shared_ptr<kratos::Stmt> *)auStack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"child",
             (allocator<char> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pGVar2 = kratos::Context::generator((Context *)local_2c8,(string *)auStack_88);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"clk",
             (allocator<char> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pPVar4 = kratos::Generator::port(pGVar2,In,(string *)auStack_88,1,Clock);
  std::__cxx11::string::~string((string *)auStack_88);
  parent_src.field_2._8_8_ = pGVar2;
  kratos::Generator::sequential
            ((Generator *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  _Var1 = if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar4->super_Var).super_enable_shared_from_this<kratos::Var>);
  auStack_88 = (undefined1  [8])((ulong)auStack_88 & 0xffffffff00000000);
  src._M_t._M_impl._0_8_ = src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = parent_src._M_dataplus._M_p;
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)_Var1._M_pi,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)auStack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src._M_t._M_impl.super__Rb_tree_header);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  _Var1 = if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"a",(allocator<char> *)(child_src.field_2._M_local_buf + 8));
  this_01 = parent_src.field_2._8_8_;
  pVVar6 = kratos::Generator::var((Generator *)parent_src.field_2._8_8_,(string *)auStack_88,1);
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)&gtest_ar__4.message_,pVVar6);
  src._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)gtest_ar__4.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  parent_src._M_dataplus = child_src._M_dataplus;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  child_src._M_dataplus._M_p = (pointer)0x0;
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)_Var1._M_pi,
             (shared_ptr<kratos::Stmt> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child_src);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"b",(allocator<char> *)(child_src.field_2._M_local_buf + 8));
  pVVar6 = kratos::Generator::var((Generator *)this_01,(string *)auStack_88,1);
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)&gtest_ar__4.message_,pVVar6);
  src._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)gtest_ar__4.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  parent_src._M_dataplus = child_src._M_dataplus;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  child_src._M_dataplus._M_p = (pointer)0x0;
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)
             if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             (shared_ptr<kratos::Stmt> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child_src);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"child2",
             (allocator<char> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pGVar2 = kratos::Context::generator((Context *)local_2c8,(string *)auStack_88);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"clk",
             (allocator<char> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pPVar5 = kratos::Generator::port(pGVar2,In,(string *)auStack_88,1,Clock);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"clk_en",
             (allocator<char> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pPVar7 = kratos::Generator::port(pGVar2,In,(string *)auStack_88,1,ClockEnable);
  std::__cxx11::string::~string((string *)auStack_88);
  right = kratos::Const::constant(1,1,false);
  kratos::Generator::wire(pGVar2,&pPVar7->super_Var,&right->super_Var);
  kratos::Generator::sequential
            ((Generator *)
             &child_seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  _Var1 = child_seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar5->super_Var).super_enable_shared_from_this<kratos::Var>);
  auStack_88 = (undefined1  [8])((ulong)auStack_88 & 0xffffffff00000000);
  src._M_t._M_impl._0_8_ = src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = parent_src._M_dataplus._M_p;
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)_Var1._M_pi,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)auStack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src._M_t._M_impl.super__Rb_tree_header);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"a",(allocator<char> *)(child_src.field_2._M_local_buf + 8));
  pVVar6 = kratos::Generator::var(pGVar2,(string *)auStack_88,1);
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)&gtest_ar__4.message_,pVVar6);
  src._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)gtest_ar__4.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  parent_src._M_dataplus = child_src._M_dataplus;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  child_src._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)local_170,
             (shared_ptr<kratos::Stmt> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child_src);
  std::__cxx11::string::~string((string *)auStack_88);
  _Var1 = child_seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_88,
             (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)local_170);
  kratos::StmtBlock::add_stmt((StmtBlock *)_Var1._M_pi,(shared_ptr<kratos::Stmt> *)auStack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"child3",
             (allocator<char> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  this_02 = kratos::Context::generator((Context *)local_2c8,(string *)auStack_88);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"clk",
             (allocator<char> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pPVar7 = kratos::Generator::port(this_02,In,(string *)auStack_88,1,Clock);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"clk_en",
             (allocator<char> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  child_seq2.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           kratos::Generator::port(this_02,In,(string *)auStack_88,1,ClockEnable);
  std::__cxx11::string::~string((string *)auStack_88);
  kratos::Generator::sequential((Generator *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar7->super_Var).super_enable_shared_from_this<kratos::Var>);
  auStack_88 = (undefined1  [8])((ulong)auStack_88 & 0xffffffff00000000);
  src._M_t._M_impl._0_8_ = src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = parent_src._M_dataplus._M_p;
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)
             child_seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)auStack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src._M_t._M_impl.super__Rb_tree_header);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  std::make_shared<kratos::IfStmt,kratos::Port&>
            ((Port *)&if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"a",(allocator<char> *)(child_src.field_2._M_local_buf + 8));
  pVVar6 = kratos::Generator::var(this_02,(string *)auStack_88,1);
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)&gtest_ar__4.message_,pVVar6);
  src._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)gtest_ar__4.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  parent_src._M_dataplus = child_src._M_dataplus;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  child_src._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)
             if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi,(shared_ptr<kratos::Stmt> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child_src);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_88,
             (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
             &if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)c.tracked_generators_._M_h._M_single_bucket,
             (shared_ptr<kratos::Stmt> *)auStack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"child",(allocator<char> *)&gtest_ar__4.message_);
  _Var1 = child_seq3.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)
             &src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             (parent_src.field_2._8_8_ + 0x68));
  kratos::Generator::add_child_generator
            ((Generator *)_Var1._M_pi,(string *)auStack_88,
             (shared_ptr<kratos::Generator> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"child2",(allocator<char> *)&gtest_ar__4.message_);
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)
             &src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &pGVar2->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator
            ((Generator *)_Var1._M_pi,(string *)auStack_88,
             (shared_ptr<kratos::Generator> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"child3",(allocator<char> *)&gtest_ar__4.message_);
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)
             &src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &this_02->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator
            ((Generator *)_Var1._M_pi,(string *)auStack_88,
             (shared_ptr<kratos::Generator> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parent_src);
  std::__cxx11::string::~string((string *)auStack_88);
  kratos::Generator::wire((Generator *)_Var1._M_pi,&pPVar4->super_Var,&pPVar3->super_Var);
  kratos::Generator::wire((Generator *)_Var1._M_pi,&pPVar5->super_Var,&pPVar3->super_Var);
  kratos::Generator::wire((Generator *)_Var1._M_pi,&pPVar7->super_Var,&pPVar3->super_Var);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"clk_en",
             (allocator<char> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pPVar3 = kratos::Generator::port((Generator *)_Var1._M_pi,In,(string *)auStack_88,1,ClockEnable);
  std::__cxx11::string::~string((string *)auStack_88);
  kratos::Generator::wire
            ((Generator *)_Var1._M_pi,
             (Var *)child_seq2.
                    super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,&pPVar3->super_Var);
  kratos::auto_insert_clock_enable((Generator *)_Var1._M_pi);
  kratos::fix_assignment_type((Generator *)_Var1._M_pi);
  kratos::create_module_instantiation((Generator *)_Var1._M_pi);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)auStack_88,(kratos *)_Var1._M_pi,top);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"parent",
             (allocator<char> *)(child_src.field_2._M_local_buf + 8));
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)auStack_88,(key_type *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = iVar8._M_node != (_Base_ptr)&src;
  child_src._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::~string((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((char)gtest_ar__4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl == '\0') {
    testing::Message::Message((Message *)((long)&child_src.field_2 + 8));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (internal *)&gtest_ar__4.message_,
               (AssertionResult *)"src.find(\"parent\") != src.end()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&child_src2.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe0,(char *)src._M_t._M_impl.super__Rb_tree_header._M_node_count);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&child_src2.field_2 + 8),
               (Message *)((long)&child_src.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&child_src2.field_2 + 8));
    std::__cxx11::string::~string((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (child_src.field_2._8_8_ != 0) {
      (**(code **)(*(long *)child_src.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&child_src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"child",
             (allocator<char> *)(child_src.field_2._M_local_buf + 8));
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)auStack_88,(key_type *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = iVar8._M_node != (_Base_ptr)&src;
  child_src._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::~string((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((char)gtest_ar__4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl == '\0') {
    testing::Message::Message((Message *)((long)&child_src.field_2 + 8));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (internal *)&gtest_ar__4.message_,
               (AssertionResult *)"src.find(\"child\") != src.end()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&child_src2.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe1,(char *)src._M_t._M_impl.super__Rb_tree_header._M_node_count);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&child_src2.field_2 + 8),
               (Message *)((long)&child_src.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&child_src2.field_2 + 8));
    std::__cxx11::string::~string((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (child_src.field_2._8_8_ != 0) {
      (**(code **)(*(long *)child_src.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&child_src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"child2",
             (allocator<char> *)(child_src.field_2._M_local_buf + 8));
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)auStack_88,(key_type *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = iVar8._M_node != (_Base_ptr)&src;
  child_src._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::~string((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((char)gtest_ar__4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl == '\0') {
    testing::Message::Message((Message *)((long)&child_src.field_2 + 8));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (internal *)&gtest_ar__4.message_,
               (AssertionResult *)"src.find(\"child2\") != src.end()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&child_src2.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe2,(char *)src._M_t._M_impl.super__Rb_tree_header._M_node_count);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&child_src2.field_2 + 8),
               (Message *)((long)&child_src.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&child_src2.field_2 + 8));
    std::__cxx11::string::~string((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (child_src.field_2._8_8_ != 0) {
      (**(code **)(*(long *)child_src.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&child_src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,"child3",
             (allocator<char> *)(child_src.field_2._M_local_buf + 8));
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)auStack_88,(key_type *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = iVar8._M_node != (_Base_ptr)&src;
  child_src._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::~string((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((char)gtest_ar__4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl == '\0') {
    testing::Message::Message((Message *)((long)&child_src.field_2 + 8));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (internal *)&gtest_ar__4.message_,
               (AssertionResult *)"src.find(\"child3\") != src.end()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&child_src2.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe3,(char *)src._M_t._M_impl.super__Rb_tree_header._M_node_count);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&child_src2.field_2 + 8),
               (Message *)((long)&child_src.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&child_src2.field_2 + 8));
    std::__cxx11::string::~string((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (child_src.field_2._8_8_ != 0) {
      (**(code **)(*(long *)child_src.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&child_src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar__4.message_,"parent",
             (allocator<char> *)(child_src.field_2._M_local_buf + 8));
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)auStack_88,(key_type *)&gtest_ar__4.message_);
  std::__cxx11::string::string
            ((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,(string *)pmVar9);
  std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(child_src.field_2._M_local_buf + 8),"child",
             (allocator<char> *)(child_src2.field_2._M_local_buf + 8));
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)auStack_88,(key_type *)((long)&child_src.field_2 + 8));
  std::__cxx11::string::string((string *)&gtest_ar__4.message_,(string *)pmVar9);
  std::__cxx11::string::~string((string *)(child_src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(child_src2.field_2._M_local_buf + 8),"child2",local_108);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)auStack_88,(key_type *)((long)&child_src2.field_2 + 8));
  std::__cxx11::string::string((string *)(child_src.field_2._M_local_buf + 8),(string *)pmVar9);
  std::__cxx11::string::~string((string *)(child_src2.field_2._M_local_buf + 8));
  lVar10 = std::__cxx11::string::find
                     ((char *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count,0x21f4ba);
  gtest_ar__4.success_ = false;
  gtest_ar__4._1_7_ = 0;
  local_108[0] = (allocator<char>)(lVar10 != -1);
  if (!(bool)local_108[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&child_src2.field_2 + 8),(internal *)local_108,
               (AssertionResult *)"parent_src.find(\"else if (clk_en)\") != std::string::npos",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe7,(char *)child_src2.field_2._8_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    std::__cxx11::string::~string((string *)(child_src2.field_2._M_local_buf + 8));
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar__4);
  lVar10 = std::__cxx11::string::find((char *)&gtest_ar__4.message_,0x21f4bf);
  gtest_ar__4.success_ = false;
  gtest_ar__4._1_7_ = 0;
  local_108[0] = (allocator<char>)(lVar10 != -1);
  if (!(bool)local_108[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&child_src2.field_2 + 8),(internal *)local_108,
               (AssertionResult *)"child_src.find(\"if (clk_en)\") != std::string::npos","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe8,(char *)child_src2.field_2._8_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    std::__cxx11::string::~string((string *)(child_src2.field_2._M_local_buf + 8));
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar__4);
  lVar10 = std::__cxx11::string::find(child_src.field_2._M_local_buf + 8,0x21f4bf);
  gtest_ar__4.success_ = false;
  gtest_ar__4._1_7_ = 0;
  local_108[0] = (allocator<char>)(lVar10 != -1);
  if (!(bool)local_108[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&child_src2.field_2 + 8),(internal *)local_108,
               (AssertionResult *)"child_src2.find(\"if (clk_en)\") != std::string::npos","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe9,(char *)child_src2.field_2._8_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    std::__cxx11::string::~string((string *)(child_src2.field_2._M_local_buf + 8));
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar__4);
  std::__cxx11::string::~string((string *)(child_src.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
  std::__cxx11::string::~string((string *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)auStack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_child3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child_seq3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_child2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child_seq2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child_seq);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&seq);
  kratos::Context::~Context((Context *)local_2c8);
  return;
}

Assistant:

TEST(pass, insert_clk_en) {  // NOLINT
    Context c;
    auto &parent = c.generator("parent");
    auto &clk = parent.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &rst = parent.port(PortDirection::In, "rst", 1, PortType::AsyncReset);
    auto &a = parent.port(PortDirection::Out, "a", 1);

    auto seq = parent.sequential();
    seq->add_condition({EventEdgeType::Posedge, clk.shared_from_this()});
    seq->add_condition({EventEdgeType::Posedge, rst.shared_from_this()});
    auto if_ = std::make_shared<IfStmt>(rst);
    if_->add_then_stmt(a.assign(constant(1, 1)));
    if_->add_else_stmt(a.assign(constant(0, 1)));
    seq->add_stmt(if_);

    // add child generator
    auto &child = c.generator("child");
    auto &clk_child = child.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto child_seq = child.sequential();
    child_seq->add_condition({EventEdgeType::Posedge, clk_child.shared_from_this()});
    child_seq->add_stmt(child.var("a", 1).assign(constant(1, 1)));
    child_seq->add_stmt(child.var("b", 1).assign(constant(1, 1)));

    // another child generator
    auto &child2 = c.generator("child2");
    auto &clk_child2 = child2.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &clk_en_child2 = child2.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    // always const
    child2.wire(clk_en_child2, constant(1, 1));
    auto child_seq2 = child2.sequential();
    child_seq2->add_condition({EventEdgeType::Posedge, clk_child2.shared_from_this()});
    auto if_child2 = std::make_shared<IfStmt>(clk_en_child2);
    if_child2->add_then_stmt(child2.var("a", 1).assign(constant(1, 1)));
    child_seq2->add_stmt(if_child2);

    auto &child3 = c.generator("child3");
    auto &clk_child3 = child3.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &clk_en_child3 = child3.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    auto child_seq3 = child3.sequential();
    child_seq2->add_condition({EventEdgeType::Posedge, clk_child3.shared_from_this()});
    auto if_child3 = std::make_shared<IfStmt>(clk_en_child3);
    if_child3->add_then_stmt(child3.var("a", 1).assign(constant(1, 1)));
    child_seq3->add_stmt(if_child3);

    parent.add_child_generator("child", child.shared_from_this());
    parent.add_child_generator("child2", child2.shared_from_this());
    parent.add_child_generator("child3", child3.shared_from_this());
    parent.wire(clk_child, clk);
    parent.wire(clk_child2, clk);
    parent.wire(clk_child3, clk);

    // add clock enable
    auto &parent_clk_en = parent.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    // wire it to child3
    parent.wire(clk_en_child3, parent_clk_en);
    auto_insert_clock_enable(&parent);
    fix_assignment_type(&parent);
    create_module_instantiation(&parent);
    auto src = generate_verilog(&parent);
    EXPECT_TRUE(src.find("parent") != src.end());
    EXPECT_TRUE(src.find("child") != src.end());
    EXPECT_TRUE(src.find("child2") != src.end());
    EXPECT_TRUE(src.find("child3") != src.end());
    auto parent_src = src.at("parent");
    auto child_src = src.at("child");
    auto child_src2 = src.at("child2");
    EXPECT_TRUE(parent_src.find("else if (clk_en)") != std::string::npos);
    EXPECT_TRUE(child_src.find("if (clk_en)") != std::string::npos);
    EXPECT_TRUE(child_src2.find("if (clk_en)") != std::string::npos);
}